

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O1

uint SOIL_load_OGL_single_cubemap
               (char *filename,char *face_order,int force_channels,uint reuse_texture_ID,uint flags)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  stbi_uc *data;
  int channels;
  int height;
  int width;
  int local_3c;
  int local_38;
  int local_34;
  
  if (filename == (char *)0x0) {
    result_string_pointer = "Invalid single cube map file name";
  }
  else {
    if (((flags & 0x40) != 0) &&
       (uVar1 = SOIL_direct_load_DDS(filename,reuse_texture_ID,flags,1), uVar1 != 0)) {
      return uVar1;
    }
    lVar3 = 0;
    do {
      if ((0x13 < (byte)face_order[lVar3] - 0x44) ||
         ((0xa8403U >> ((byte)face_order[lVar3] - 0x44 & 0x1f) & 1) == 0)) {
        result_string_pointer = "Invalid single cube map face order";
        return 0;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 6);
    iVar2 = query_cubemap_capability();
    if (iVar2 == 1) {
      data = stbi_load(filename,&local_34,&local_38,&local_3c,force_channels);
      if (data == (stbi_uc *)0x0) {
        result_string_pointer = stbi_failure_reason();
      }
      else {
        result_string_pointer = "Image loaded";
      }
      if (force_channels - 1U < 4) {
        local_3c = force_channels;
      }
      if (data == (stbi_uc *)0x0) {
        result_string_pointer = stbi_failure_reason();
      }
      else {
        if ((local_34 == local_38 * 6) || (local_34 * 6 == local_38)) {
          uVar1 = SOIL_create_OGL_single_cubemap
                            (data,local_34,local_38,local_3c,face_order,reuse_texture_ID,flags);
          free(data);
          return uVar1;
        }
        free(data);
        result_string_pointer = "Single cubemap image must have a 6:1 ratio";
      }
    }
    else {
      result_string_pointer = "No cube map capability present";
    }
  }
  return 0;
}

Assistant:

unsigned int
	SOIL_load_OGL_single_cubemap
	(
		const char *filename,
		const char face_order[6],
		int force_channels,
		unsigned int reuse_texture_ID,
		unsigned int flags
	)
{
	/*	variables	*/
	unsigned char* img;
	int width, height, channels, i;
	unsigned int tex_id = 0;
	/*	error checking	*/
	if( filename == NULL )
	{
		result_string_pointer = "Invalid single cube map file name";
		return 0;
	}
	/*	does the user want direct uploading of the image as a DDS file?	*/
	if( flags & SOIL_FLAG_DDS_LOAD_DIRECT )
	{
		/*	1st try direct loading of the image as a DDS file
			note: direct uploading will only load what is in the
			DDS file, no MIPmaps will be generated, the image will
			not be flipped, etc.	*/
		tex_id = SOIL_direct_load_DDS( filename, reuse_texture_ID, flags, 1 );
		if( tex_id )
		{
			/*	hey, it worked!!	*/
			return tex_id;
		}
	}
	/*	face order checking	*/
	for( i = 0; i < 6; ++i )
	{
		if( (face_order[i] != 'N') &&
			(face_order[i] != 'S') &&
			(face_order[i] != 'W') &&
			(face_order[i] != 'E') &&
			(face_order[i] != 'U') &&
			(face_order[i] != 'D') )
		{
			result_string_pointer = "Invalid single cube map face order";
			return 0;
		};
	}
	/*	capability checking	*/
	if( query_cubemap_capability() != SOIL_CAPABILITY_PRESENT )
	{
		result_string_pointer = "No cube map capability present";
		return 0;
	}
	/*	1st off, try to load the full image	*/
	img = SOIL_load_image( filename, &width, &height, &channels, force_channels );
	/*	channels holds the original number of channels, which may have been forced	*/
	if( (force_channels >= 1) && (force_channels <= 4) )
	{
		channels = force_channels;
	}
	if( NULL == img )
	{
		/*	image loading failed	*/
		result_string_pointer = stbi_failure_reason();
		return 0;
	}
	/*	now, does this image have the right dimensions?	*/
	if( (width != 6*height) &&
		(6*width != height) )
	{
		SOIL_free_image_data( img );
		result_string_pointer = "Single cubemap image must have a 6:1 ratio";
		return 0;
	}
	/*	try the image split and create	*/
	tex_id = SOIL_create_OGL_single_cubemap(
			img, width, height, channels,
			face_order, reuse_texture_ID, flags
			);
	/*	nuke the temporary image data and return the texture handle	*/
	SOIL_free_image_data( img );
	return tex_id;
}